

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_wString __thiscall
ON_Font::Description
          (ON_Font *this,NameLocale name_local,wchar_t family_separator,
          wchar_t weight_width_slope_separator,bool bIncludeUndelinedAndStrikethrough)

{
  byte in_R9B;
  bool bIncludeNotOnDevice;
  bool bIncludeUndelinedAndStrikethrough_local;
  wchar_t weight_width_slope_separator_local;
  wchar_t family_separator_local;
  NameLocale name_local_local;
  ON_Font *this_local;
  
  Description(this,name_local,family_separator & 0xff,weight_width_slope_separator,
              bIncludeUndelinedAndStrikethrough,(bool)(in_R9B & 1));
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_Font::Description(
  ON_Font::NameLocale name_local,
  wchar_t family_separator,
  wchar_t weight_width_slope_separator,
  bool bIncludeUndelinedAndStrikethrough
) const
{
  // Do not change bIncludeNotOnDevice to false.
  // If you have a situation where you do not want the
  // missing font description, then use the override that
  // has bIncludeNotOnDevice as a parameter.
  const bool bIncludeNotOnDevice = true;

  return this->Description(
    name_local,
    family_separator,
    weight_width_slope_separator,
    bIncludeUndelinedAndStrikethrough,
    bIncludeNotOnDevice
  );
}